

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_insert.cpp
# Opt level: O3

unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true> __thiscall
duckdb::Transformer::TransformInsert(Transformer *this,PGInsertStmt *stmt)

{
  uint uVar1;
  PGList *list;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  string *psVar3;
  _Head_base<0UL,_duckdb::OnConflictInfo_*,_false> _Var4;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var5;
  undefined8 uVar6;
  InsertStatement *this_00;
  pointer pIVar7;
  ParserException *this_01;
  InternalException *this_02;
  InsertColumnOrder IVar8;
  long in_RDX;
  pointer *__ptr;
  undefined8 *puVar9;
  PGOnConflictActionAlias type;
  PGInsertStmt *pPVar10;
  QualifiedName qname;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  _Alloc_hider local_70 [2];
  char local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  this_00 = (InsertStatement *)operator_new(0x178);
  InsertStatement::InsertStatement(this_00);
  (this->parent).ptr = (Transformer *)this_00;
  if (*(Transformer **)(in_RDX + 0x38) != (Transformer *)0x0) {
    local_90._0_8_ = *(Transformer **)(in_RDX + 0x38);
    optional_ptr<duckdb_libpgquery::PGWithClause,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)local_90);
    uVar6 = local_90._0_8_;
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    TransformCTE((Transformer *)stmt,(PGWithClause *)uVar6,&pIVar7->cte_map);
  }
  if ((*(long *)(in_RDX + 0x10) != 0) &&
     (puVar9 = *(undefined8 **)(*(long *)(in_RDX + 0x10) + 8), puVar9 != (undefined8 *)0x0)) {
    do {
      local_90._0_8_ = *puVar9;
      pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
               ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                             *)this);
      optional_ptr<duckdb_libpgquery::PGResTarget,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)local_90);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pIVar7->columns,(char **)(local_90._0_8_ + 8));
      puVar9 = (undefined8 *)puVar9[1];
    } while (puVar9 != (undefined8 *)0x0);
  }
  list = *(PGList **)(in_RDX + 0x30);
  if (list != (PGList *)0x0) {
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    TransformExpressionList((Transformer *)stmt,list,&pIVar7->returning_list);
  }
  if (*(long *)(in_RDX + 0x18) == 0) {
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    pIVar7->default_values = true;
  }
  else {
    TransformSelectStmt((Transformer *)local_90,(PGNode *)stmt,SUB81(*(long *)(in_RDX + 0x18),0));
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar6 = local_90._0_8_;
    local_90._0_8_ = (Transformer *)0x0;
    _Var2._M_head_impl =
         (pIVar7->select_statement).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pIVar7->select_statement).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)uVar6
    ;
    if (_Var2._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
      if ((Transformer *)local_90._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
    }
  }
  TransformQualifiedName((QualifiedName *)local_90,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8))
  ;
  pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
           operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pIVar7->table);
  pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
           operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                       *)this);
  type = (PGOnConflictActionAlias)local_70;
  ::std::__cxx11::string::_M_assign((string *)&pIVar7->schema);
  psVar3 = *(string **)(in_RDX + 0x28);
  if (psVar3 != (string *)0x0) {
    if (*(int *)(in_RDX + 0x20) != 0) {
      this_01 = (ParserException *)__cxa_allocate_exception(0x10);
      local_b0._0_8_ = local_b0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,
                 "You can not provide both OR REPLACE|IGNORE and an ON CONFLICT clause, please remove the first if you want to have more granual control"
                 ,"");
      ParserException::ParserException(this_01,(string *)local_b0);
      __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
    operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                *)this);
    TransformOnConflictClause((Transformer *)local_b0,(PGOnConflictClause *)stmt,psVar3);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar6 = local_b0._0_8_;
    local_b0._0_8_ = (Transformer *)0x0;
    _Var4._M_head_impl =
         (pIVar7->on_conflict_info).
         super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>
         .super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl;
    (pIVar7->on_conflict_info).
    super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>.
    super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl = (OnConflictInfo *)uVar6;
    if (_Var4._M_head_impl != (OnConflictInfo *)0x0) {
      ::std::default_delete<duckdb::OnConflictInfo>::operator()
                ((default_delete<duckdb::OnConflictInfo> *)&pIVar7->on_conflict_info,
                 _Var4._M_head_impl);
      if ((Transformer *)local_b0._0_8_ != (Transformer *)0x0) {
        ::std::default_delete<duckdb::OnConflictInfo>::operator()
                  ((default_delete<duckdb::OnConflictInfo> *)local_b0,
                   (OnConflictInfo *)local_b0._0_8_);
      }
    }
    pPVar10 = stmt;
    TransformRangeVar((Transformer *)local_b0,(PGRangeVar *)stmt);
    type = (PGOnConflictActionAlias)pPVar10;
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar6 = local_b0._0_8_;
    local_b0._0_8_ = (Transformer *)0x0;
    _Var5._M_head_impl =
         (pIVar7->table_ref).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pIVar7->table_ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar6;
    if (_Var5._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
      if ((Transformer *)local_b0._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_b0._0_8_ + 8))();
      }
    }
  }
  uVar1 = *(uint *)(in_RDX + 0x20);
  if (uVar1 != 0) {
    unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
    operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                *)this);
    DummyOnConflictClause((Transformer *)local_b0,type,(string *)(ulong)uVar1);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar6 = local_b0._0_8_;
    local_b0._0_8_ = (Transformer *)0x0;
    _Var4._M_head_impl =
         (pIVar7->on_conflict_info).
         super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>
         .super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl;
    (pIVar7->on_conflict_info).
    super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>.
    super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl = (OnConflictInfo *)uVar6;
    if (_Var4._M_head_impl != (OnConflictInfo *)0x0) {
      ::std::default_delete<duckdb::OnConflictInfo>::operator()
                ((default_delete<duckdb::OnConflictInfo> *)&pIVar7->on_conflict_info,
                 _Var4._M_head_impl);
      if ((Transformer *)local_b0._0_8_ != (Transformer *)0x0) {
        ::std::default_delete<duckdb::OnConflictInfo>::operator()
                  ((default_delete<duckdb::OnConflictInfo> *)local_b0,
                   (OnConflictInfo *)local_b0._0_8_);
      }
    }
    TransformRangeVar((Transformer *)local_b0,(PGRangeVar *)stmt);
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    uVar6 = local_b0._0_8_;
    local_b0._0_8_ = (Transformer *)0x0;
    _Var5._M_head_impl =
         (pIVar7->table_ref).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pIVar7->table_ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar6;
    if (_Var5._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
      if ((Transformer *)local_b0._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_b0._0_8_ + 8))();
      }
    }
  }
  if (*(int *)(in_RDX + 0x44) == 1) {
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    IVar8 = INSERT_BY_NAME;
  }
  else {
    if (*(int *)(in_RDX + 0x44) != 0) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_b0._0_8_ = local_b0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Unrecognized insert column order in TransformInsert","");
      InternalException::InternalException(this_02,(string *)local_b0);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
             ::operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                           *)this);
    IVar8 = INSERT_BY_POSITION;
  }
  pIVar7->column_order = IVar8;
  pIVar7 = unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>::
           operator->((unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pIVar7->catalog);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (local_70[0]._M_p != local_60) {
    operator_delete(local_70[0]._M_p);
  }
  if ((Transformer *)local_90._0_8_ != (Transformer *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_);
  }
  return (unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>_>)
         (unique_ptr<duckdb::InsertStatement,_std::default_delete<duckdb::InsertStatement>_>)this;
}

Assistant:

unique_ptr<InsertStatement> Transformer::TransformInsert(duckdb_libpgquery::PGInsertStmt &stmt) {
	auto result = make_uniq<InsertStatement>();
	if (stmt.withClause) {
		TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), result->cte_map);
	}

	// first check if there are any columns specified
	if (stmt.cols) {
		for (auto c = stmt.cols->head; c != nullptr; c = lnext(c)) {
			auto target = PGPointerCast<duckdb_libpgquery::PGResTarget>(c->data.ptr_value);
			result->columns.emplace_back(target->name);
		}
	}

	// Grab and transform the returning columns from the parser.
	if (stmt.returningList) {
		TransformExpressionList(*stmt.returningList, result->returning_list);
	}
	if (stmt.selectStmt) {
		result->select_statement = TransformSelectStmt(*stmt.selectStmt, false);
	} else {
		result->default_values = true;
	}

	auto qname = TransformQualifiedName(*stmt.relation);
	result->table = qname.name;
	result->schema = qname.schema;

	if (stmt.onConflictClause) {
		if (stmt.onConflictAlias != duckdb_libpgquery::PG_ONCONFLICT_ALIAS_NONE) {
			// OR REPLACE | OR IGNORE are shorthands for the ON CONFLICT clause
			throw ParserException("You can not provide both OR REPLACE|IGNORE and an ON CONFLICT clause, please remove "
			                      "the first if you want to have more granual control");
		}
		result->on_conflict_info = TransformOnConflictClause(stmt.onConflictClause, result->schema);
		result->table_ref = TransformRangeVar(*stmt.relation);
	}
	if (stmt.onConflictAlias != duckdb_libpgquery::PG_ONCONFLICT_ALIAS_NONE) {
		D_ASSERT(!stmt.onConflictClause);
		result->on_conflict_info = DummyOnConflictClause(stmt.onConflictAlias, result->schema);
		result->table_ref = TransformRangeVar(*stmt.relation);
	}
	switch (stmt.insert_column_order) {
	case duckdb_libpgquery::PG_INSERT_BY_POSITION:
		result->column_order = InsertColumnOrder::INSERT_BY_POSITION;
		break;
	case duckdb_libpgquery::PG_INSERT_BY_NAME:
		result->column_order = InsertColumnOrder::INSERT_BY_NAME;
		break;
	default:
		throw InternalException("Unrecognized insert column order in TransformInsert");
	}
	result->catalog = qname.catalog;
	return result;
}